

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O1

void DivVerifyUint64Uint64(void)

{
  return;
}

Assistant:

void DivVerifyUint64Uint64()
{
    TestVector< std::uint64_t, std::uint64_t, OpType::Div > tests;
    TestCase< std::uint64_t, std::uint64_t, OpType::Div > test = tests.GetNext();

    while (!tests.Done())
    {
      std::uint64_t ret;
      if( SafeDivide(test.x, test.y, ret) != test.fExpected )
      {
         //assert(false);
          err_msg( "Error in case uint64_uint64: ", test.x, test.y, test.fExpected );
      }

      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::uint64_t> si(test.x);
         si /= test.y;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case uint64_uint64 throw: ", test.x, test.y, test.fExpected );
      }

      // Also need to test the version that assigns back out
      // to a plain int, as it has different logic
      fSuccess = true;
      try
      {
         std::uint64_t x(test.x);
         x /= SafeInt<std::uint64_t>(test.y);
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case uint64_uint64 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}